

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

void __thiscall
despot::SimpleRockSample::PrintObs
          (SimpleRockSample *this,State *state,OBS_TYPE observation,ostream *out)

{
  ostream *poVar1;
  char *pcVar2;
  
  pcVar2 = "GOOD";
  if (observation == 0) {
    pcVar2 = "BAD";
  }
  poVar1 = std::operator<<(out,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void SimpleRockSample::PrintObs(const State& state, OBS_TYPE observation,
	ostream& out) const {
	out << (observation ? "GOOD" : "BAD") << endl;
}